

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFormatting.cpp
# Opt level: O2

void write_unsigned_impl<unsigned_int>
               (raw_ostream *S,uint N,size_t MinDigits,IntegerStyle Style,bool IsNegative)

{
  bool bVar1;
  byte *pbVar2;
  size_t __n;
  size_t I;
  void *pvVar3;
  long lVar4;
  void *__buf;
  ArrayRef<char> Buffer;
  char NumberBuffer [128];
  char local_38 [8];
  
  builtin_strncpy(NumberBuffer + 0x70,"0000000000000000",0x10);
  builtin_strncpy(NumberBuffer + 0x60,"0000000000000000",0x10);
  builtin_strncpy(NumberBuffer + 0x50,"0000000000000000",0x10);
  builtin_strncpy(NumberBuffer + 0x40,"0000000000000000",0x10);
  builtin_strncpy(NumberBuffer + 0x30,"0000000000000000",0x10);
  builtin_strncpy(NumberBuffer + 0x20,"0000000000000000",0x10);
  builtin_strncpy(NumberBuffer + 0x10,"0000000000000000",0x10);
  builtin_strncpy(NumberBuffer,"0000000000000000",0x10);
  pbVar2 = (byte *)(NumberBuffer + 0x7f);
  lVar4 = 0;
  do {
    *pbVar2 = (byte)((ulong)N % 10) | 0x30;
    lVar4 = lVar4 + 0x100000000;
    pbVar2 = pbVar2 + -1;
    bVar1 = 9 < N;
    N = N / 10;
  } while (bVar1);
  __buf = (void *)(lVar4 >> 0x20);
  if (IsNegative) {
    llvm::raw_ostream::operator<<(S,'-');
  }
  __n = CONCAT71((int7)((ulong)pbVar2 >> 8),Style == Number || MinDigits <= __buf);
  pvVar3 = __buf;
  if (Style != Number && MinDigits > __buf) {
    for (; pvVar3 < MinDigits; pvVar3 = (void *)((long)pvVar3 + 1)) {
      llvm::raw_ostream::operator<<(S,'0');
    }
  }
  if (Style == Number) {
    Buffer.Length = (size_type)__buf;
    Buffer.Data = local_38 + -(long)__buf;
    writeWithCommas(S,Buffer);
  }
  else {
    llvm::raw_ostream::write(S,(int)(local_38 + -(long)__buf),__buf,__n);
  }
  return;
}

Assistant:

static void write_unsigned_impl(raw_ostream &S, T N, size_t MinDigits,
                                IntegerStyle Style, bool IsNegative) {
  static_assert(std::is_unsigned<T>::value, "Value is not unsigned!");

  char NumberBuffer[128];
  std::memset(NumberBuffer, '0', sizeof(NumberBuffer));

  size_t Len = 0;
  Len = format_to_buffer(N, NumberBuffer);

  if (IsNegative)
    S << '-';

  if (Len < MinDigits && Style != IntegerStyle::Number) {
    for (size_t I = Len; I < MinDigits; ++I)
      S << '0';
  }

  if (Style == IntegerStyle::Number) {
    writeWithCommas(S, ArrayRef<char>(std::end(NumberBuffer) - Len, Len));
  } else {
    S.write(std::end(NumberBuffer) - Len, Len);
  }
}